

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O3

void __thiscall
Assimp::SplitLargeMeshesProcess_Vertex::Execute
          (SplitLargeMeshesProcess_Vertex *this,aiScene *pScene)

{
  pointer ppVar1;
  uint uVar2;
  Logger *pLVar3;
  aiMesh **ppaVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  avList;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_38;
  
  if (pScene == (aiScene *)0x0) {
    return;
  }
  if (this->LIMIT == 0xffffffff) {
    return;
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"SplitLargeMeshesProcess_Vertex begin");
  local_38.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = (ulong)pScene->mNumMeshes;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      if (pScene->mMeshes[uVar6]->mPrimitiveTypes == 1) goto LAB_003d0f82;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        SplitMesh(this,(uint)uVar6,pScene->mMeshes[uVar6],&local_38);
        uVar6 = uVar6 + 1;
        uVar5 = (ulong)pScene->mNumMeshes;
      } while (uVar6 < uVar5);
      goto LAB_003d0ec3;
    }
  }
  uVar5 = 0;
LAB_003d0ec3:
  if ((long)local_38.
            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_38.
            super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar5) {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
  }
  else {
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    ppVar1 = local_38.
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar7 = local_38.
             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)local_38.
                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38.
                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pScene->mNumMeshes = (uint)uVar5;
    ppaVar4 = (aiMesh **)
              operator_new__(-(ulong)(uVar5 >> 0x3d != 0) |
                             (long)local_38.
                                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 1);
    pScene->mMeshes = ppaVar4;
    if (ppVar1 != ppVar7) {
      uVar2 = 1;
      uVar5 = 0;
      do {
        pScene->mMeshes[uVar5] = ppVar7[uVar5].first;
        uVar5 = (ulong)uVar2;
        uVar2 = uVar2 + 1;
        ppVar7 = local_38.
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)local_38.
                                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_38.
                                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    SplitLargeMeshesProcess_Triangle::UpdateNode(pScene->mRootNode,&local_38);
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
  }
LAB_003d0f82:
  if (local_38.
      super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Vertex::Execute( aiScene* pScene) {
    if (0xffffffff == this->LIMIT || nullptr == pScene ) {
        return;
    }

    ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex begin");

    std::vector<std::pair<aiMesh*, unsigned int> > avList;

    //Check for point cloud first, 
    //Do not process point cloud, splitMesh works only with faces data
    for (unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        if ( pScene->mMeshes[a]->mPrimitiveTypes == aiPrimitiveType_POINT ) {
            return;
        }
    }

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a ) {
        this->SplitMesh(a, pScene->mMeshes[a], avList);
    }

    if (avList.size() != pScene->mNumMeshes) {
        // it seems something has been split. rebuild the mesh list
        delete[] pScene->mMeshes;
        pScene->mNumMeshes = (unsigned int)avList.size();
        pScene->mMeshes = new aiMesh*[avList.size()];

        for (unsigned int i = 0; i < avList.size();++i) {
            pScene->mMeshes[i] = avList[i].first;
        }

        // now we need to update all nodes
        SplitLargeMeshesProcess_Triangle::UpdateNode(pScene->mRootNode,avList);
        ASSIMP_LOG_INFO("SplitLargeMeshesProcess_Vertex finished. Meshes have been split");
    } else {
        ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Vertex finished. There was nothing to do");
    }
}